

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashAndTry(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = iLit0;
  if (iLit0 < 2) {
    iVar2 = iLit1;
    if (iLit0 == 0) {
      iVar2 = iLit0;
    }
  }
  else if (iLit1 < 2) {
    if (iLit1 == 0) {
      iVar2 = iLit1;
    }
  }
  else if (iLit0 != iLit1) {
    iVar1 = Abc_LitNot(iLit1);
    iVar2 = 0;
    if (iVar1 != iLit0) {
      iVar2 = iLit1;
      if ((uint)iLit0 < (uint)iLit1) {
        iVar2 = iLit0;
      }
      if ((uint)iLit1 < (uint)iLit0) {
        iLit1 = iLit0;
      }
      piVar3 = Gia_ManHashFind(p,iVar2,iLit1,-1);
      iVar2 = -1;
      if (*piVar3 != 0) {
        iVar2 = Abc_Var2Lit(*piVar3,0);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int Gia_ManHashAndTry( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( iLit0 < 2 )
        return iLit0 ? iLit1 : 0;
    if ( iLit1 < 2 )
        return iLit1 ? iLit0 : 0;
    if ( iLit0 == iLit1 )
        return iLit1;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 0;
    if ( iLit0 > iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    {
        int * pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace ) 
            return Abc_Var2Lit( *pPlace, 0 );
        return -1;
    }
}